

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRead.c
# Opt level: O2

Vec_Ptr_t * Amap_DeriveTokens(char *pBuffer)

{
  int iVar1;
  Vec_Ptr_t *p;
  void **ppvVar2;
  char *__s1;
  char *__s1_00;
  
  p = (Vec_Ptr_t *)malloc(0x10);
  p->nCap = 1000;
  p->nSize = 0;
  ppvVar2 = (void **)malloc(8000);
  p->pArray = ppvVar2;
  __s1 = strtok(pBuffer," =\t\r\n");
  do {
    do {
      if (__s1 == (char *)0x0) {
        return p;
      }
      Vec_PtrPush(p,__s1);
      __s1_00 = strtok((char *)0x0," =\t\r\n");
      __s1 = (char *)0x0;
    } while ((__s1_00 == (char *)0x0) ||
            (iVar1 = strcmp(__s1_00,"LATCH"), __s1 = __s1_00, iVar1 != 0));
    do {
      __s1 = __s1_00;
      iVar1 = strcmp(__s1,"GATE");
      if (iVar1 == 0) break;
      __s1_00 = strtok((char *)0x0," =\t\r\n");
      __s1 = (char *)0x0;
    } while (__s1_00 != (char *)0x0);
  } while( true );
}

Assistant:

Vec_Ptr_t * Amap_DeriveTokens( char * pBuffer )
{
    Vec_Ptr_t * vTokens;
    char * pToken;
    vTokens = Vec_PtrAlloc( 1000 );
    pToken = strtok( pBuffer, " =\t\r\n" );
    while ( pToken )
    {
        Vec_PtrPush( vTokens, pToken );
        pToken = strtok( NULL, " =\t\r\n" );
        // skip latches
        if ( pToken && strcmp( pToken, "LATCH" ) == 0 )
            while ( pToken && strcmp( pToken, "GATE" ) != 0 )
                pToken = strtok( NULL, " =\t\r\n" );
    }
    return vTokens;
}